

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O3

void __thiscall
rsg::ProgramExecutor::execute
          (ProgramExecutor *this,Shader *vertexShader,Shader *fragmentShader,
          vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *uniformValues)

{
  int iVar1;
  ShaderInput *pSVar2;
  Variable *pVVar3;
  pointer pSVar4;
  ulong uVar5;
  ConstValueAccess vtx1;
  ConstValueRangeAccess valueRange;
  ConstValueAccess vtx2;
  ConstValueAccess vtx3;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  deBool dVar9;
  int iVar10;
  int iVar11;
  VaryingStorage *pVVar12;
  TestError *this_00;
  VariableType *this_01;
  uint uVar13;
  uint uVar14;
  int iVar15;
  Scalar *pSVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  pointer pVVar20;
  pointer ppSVar21;
  int iVar22;
  ProgramExecutor *this_02;
  ulong uVar23;
  int iVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float __x;
  ExecValueAccess EVar32;
  ConstStridedValueAccess<64> src;
  ValueAccess dst;
  StridedValueAccess<64> dst_00;
  ConstValueAccess vtx0;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> outputs;
  Vec4 c;
  ExecutionContext execCtx;
  VaryingStore varyingStore;
  ulong local_1d8;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> local_1b8;
  ConstStridedValueAccess<64> local_198;
  Shader *local_188;
  Scalar *local_180;
  VariableType *local_178;
  long local_170;
  SamplerCubeMap *local_168;
  VaryingStorage *local_160;
  int local_154;
  ProgramExecutor *local_150;
  long local_148;
  ulong local_140;
  Variable *local_138;
  ulong local_130;
  ulong local_128;
  pointer local_120;
  Variable *local_118;
  Scalar *pSStack_110;
  Variable *local_108;
  Scalar *pSStack_100;
  Variable *local_f8;
  Scalar *pSStack_f0;
  ConstStridedValueAccess<64> local_e8;
  Variable *local_d8;
  pointer pSStack_d0;
  Scalar *local_c8;
  ExecutionContext local_c0;
  VaryingStore local_68;
  
  iVar1 = this->m_gridWidth;
  iVar15 = this->m_gridHeight;
  iVar8 = iVar1 + 1;
  uVar18 = (iVar15 + 1) * iVar8;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188 = fragmentShader;
  local_150 = this;
  local_68.m_numVertices = uVar18;
  local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ExecutionContext::ExecutionContext(&local_c0,&this->m_samplers2D,&this->m_samplersCube);
  local_180 = (Scalar *)CONCAT44(local_180._4_4_,(uVar18 + 1) - (uint)((uVar18 & 0x3f) == 0));
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = &this->m_samplersCube;
  rsg::Shader::getOutputs(vertexShader,&local_1b8);
  pVVar20 = (uniformValues->
            super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pVVar20 !=
      (uniformValues->super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_198.m_type = &pVVar20->m_variable->m_type;
      local_198.m_value =
           (pVVar20->m_storage).m_value.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_e8 = (ConstStridedValueAccess<64>)
                 ExecutionContext::getValue(&local_c0,pVVar20->m_variable);
      StridedValueAccess<64>::operator=
                ((StridedValueAccess<64> *)&local_e8,(StridedValueRead<1> *)&local_198);
      pVVar20 = pVVar20 + 1;
    } while (pVVar20 !=
             (uniformValues->
             super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (0 < (int)local_180) {
    uVar13 = 0x40;
    local_178 = (VariableType *)((ulong)local_178 & 0xffffffff00000000);
    iVar19 = 0;
    iVar11 = 0;
    do {
      uVar14 = uVar18;
      if ((int)uVar13 < (int)uVar18) {
        uVar14 = uVar13;
      }
      local_160 = (VaryingStorage *)CONCAT44(local_160._4_4_,iVar11 + 1);
      uVar17 = (iVar11 + 1) * 0x40;
      if ((int)uVar18 <= (int)uVar17) {
        uVar17 = uVar18;
      }
      ppSVar21 = (vertexShader->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      if (ppSVar21 !=
          (vertexShader->m_inputs).
          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pSVar2 = *ppSVar21;
          EVar32 = ExecutionContext::getValue(&local_c0,pSVar2->m_variable);
          if (iVar11 << 6 < (int)uVar17) {
            iVar24 = 0;
            do {
              local_c8 = (pSVar2->m_max).
                         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                         super__Vector_impl_data._M_start;
              local_d8 = pSVar2->m_variable;
              pSStack_d0 = (pSVar2->m_min).
                           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                           super__Vector_impl_data._M_start;
              uVar6 = pSVar2->m_variable;
              uVar7 = (pSVar2->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                      _M_impl.super__Vector_impl_data._M_start;
              valueRange.m_min = (Scalar *)uVar7;
              valueRange.m_type = (VariableType *)uVar6;
              valueRange.m_max = local_c8;
              interpolateVertexInput<64>
                        ((StridedValueAccess<64>)EVar32.super_ConstStridedValueAccess<64>,iVar24,
                         valueRange,(float)((iVar24 + iVar19) % iVar8) / (float)iVar1,
                         (float)((iVar24 + iVar19) / iVar8) / (float)iVar15);
              iVar24 = iVar24 + 1;
            } while ((iVar19 - uVar14) + iVar24 != 0);
          }
          ppSVar21 = ppSVar21 + 1;
        } while (ppSVar21 !=
                 (vertexShader->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      rsg::Shader::execute(vertexShader,&local_c0);
      if (local_1b8.
          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1b8.
          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar24 = uVar14 + (int)local_178;
        pSVar16 = (Scalar *)
                  local_1b8.
                  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          pVVar3 = *(Variable **)pSVar16;
          dVar9 = deStringEqual((pVVar3->m_name)._M_dataplus._M_p,"gl_Position");
          if (dVar9 == 0) {
            src = (ConstStridedValueAccess<64>)ExecutionContext::getValue(&local_c0,pVVar3);
            pVVar12 = VaryingStore::getStorage
                                (&local_68,&pVVar3->m_type,(pVVar3->m_name)._M_dataplus._M_p);
            if (iVar11 << 6 < (int)uVar17) {
              iVar22 = 0;
              do {
                iVar10 = VariableType::getScalarSize(&pVVar3->m_type);
                dst.super_ConstStridedValueAccess<1>.m_value =
                     (pVVar12->m_value).
                     super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar10 * (iVar22 + iVar19);
                dst.super_ConstStridedValueAccess<1>.m_type = &pVVar3->m_type;
                copyVarying<64>(dst,src,iVar22);
                iVar22 = iVar22 + 1;
              } while (iVar24 != iVar22);
            }
          }
          pSVar16 = pSVar16 + 2;
        } while (pSVar16 !=
                 (Scalar *)
                 local_1b8.
                 super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      uVar13 = uVar13 + 0x40;
      iVar19 = iVar19 + 0x40;
      local_178 = (VariableType *)CONCAT44(local_178._4_4_,(int)local_178 + -0x40);
      iVar11 = (int)local_160;
    } while ((int)local_160 != (int)local_180);
  }
  if ((Scalar *)
      local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (Scalar *)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ExecutionContext::~ExecutionContext(&local_c0);
  ExecutionContext::ExecutionContext(&local_c0,&this->m_samplers2D,local_168);
  this_02 = local_150;
  pVVar20 = (uniformValues->
            super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pVVar20 !=
      (uniformValues->super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pVVar20->m_variable;
      local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)(pVVar20->m_storage).m_value.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_198 = (ConstStridedValueAccess<64>)
                  ExecutionContext::getValue(&local_c0,pVVar20->m_variable);
      StridedValueAccess<64>::operator=
                ((StridedValueAccess<64> *)&local_198,(StridedValueRead<1> *)&local_1b8);
      pVVar20 = pVVar20 + 1;
    } while (pVVar20 !=
             (uniformValues->
             super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rsg::Shader::getOutputs(local_188,&local_1b8);
  pSVar16 = (Scalar *)
            local_1b8.
            super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pSVar16 ==
        (Scalar *)
        local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"fragColorVar",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
                 ,299);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if ((*(Variable **)pSVar16)->m_layoutLocation == 0) break;
    pSVar16 = pSVar16 + 2;
  }
  iVar1 = (this_02->m_dst).super_ConstPixelBufferAccess.m_size.m_data[0];
  iVar15 = (this_02->m_dst).super_ConstPixelBufferAccess.m_size.m_data[1];
  uVar13 = iVar15 * iVar1;
  local_130 = (ulong)uVar13;
  uVar18 = uVar13 + 0x3f;
  if (-1 < (int)uVar13) {
    uVar18 = uVar13;
  }
  uVar14 = (uint)((uVar13 & 0x3f) != 0);
  uVar13 = uVar14 + ((int)uVar18 >> 6);
  if (uVar13 != 0 && SCARRY4(uVar14,(int)uVar18 >> 6) == (int)uVar13 < 0) {
    fVar29 = (float)iVar1 / (float)this_02->m_gridWidth;
    fVar30 = (float)iVar15 / (float)this_02->m_gridHeight;
    local_140 = (ulong)uVar13;
    iVar15 = 0x40;
    local_128 = 0;
    local_1d8 = 0;
    local_138 = *(Variable **)pSVar16;
    do {
      iVar19 = (int)local_130;
      iVar11 = iVar19;
      if (iVar15 < iVar19) {
        iVar11 = iVar15;
      }
      local_148 = local_128 << 6;
      local_128 = local_128 + 1;
      iVar24 = (int)local_128 * 0x40;
      if (iVar19 <= iVar24) {
        iVar24 = iVar19;
      }
      ppSVar21 = (local_188->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      local_170 = (long)iVar24;
      local_154 = iVar15;
      if (ppSVar21 !=
          (local_188->m_inputs).
          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_168 = (SamplerCubeMap *)CONCAT44(local_168._4_4_,(int)local_1d8 - iVar11);
        do {
          pSVar2 = *ppSVar21;
          local_120 = ppSVar21;
          EVar32 = ExecutionContext::getValue(&local_c0,pSVar2->m_variable);
          local_180 = EVar32.super_ConstStridedValueAccess<64>.m_value;
          local_178 = EVar32.super_ConstStridedValueAccess<64>.m_type;
          pVVar3 = pSVar2->m_variable;
          local_160 = VaryingStore::getStorage
                                (&local_68,&pVVar3->m_type,(pVVar3->m_name)._M_dataplus._M_p);
          if (local_148 < local_170) {
            iVar15 = 0;
            do {
              fVar25 = (float)(((int)local_1d8 + iVar15) % iVar1);
              fVar26 = floorf(fVar25 / fVar29);
              fVar31 = (float)(((int)local_1d8 + iVar15) / iVar1);
              fVar27 = floorf(fVar31 / fVar30);
              fVar25 = (fVar25 + 0.5) / fVar29;
              __x = (fVar31 + 0.5) / fVar30;
              fVar31 = floorf(fVar25);
              fVar28 = floorf(__x);
              iVar11 = VariableType::getScalarSize(&pVVar3->m_type);
              pVVar12 = local_160;
              iVar10 = (int)fVar26;
              iVar24 = iVar8 * (int)fVar27;
              pSVar4 = (local_160->m_value).
                       super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar19 = VariableType::getScalarSize(&pVVar3->m_type);
              pSStack_f0 = (pVVar12->m_value).
                           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                           super__Vector_impl_data._M_start + iVar19 * (iVar24 + iVar10 + 1);
              local_f8 = pVVar3;
              iVar19 = VariableType::getScalarSize(&pVVar3->m_type);
              iVar22 = ((int)fVar27 + 1) * iVar8;
              pSStack_100 = (pVVar12->m_value).
                            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                            super__Vector_impl_data._M_start + iVar19 * (iVar10 + iVar22);
              local_108 = pVVar3;
              iVar19 = VariableType::getScalarSize(&pVVar3->m_type);
              pSStack_110 = (pVVar12->m_value).
                            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                            super__Vector_impl_data._M_start + iVar19 * (iVar10 + iVar22 + 1);
              vtx1.m_value = pSStack_f0;
              vtx1.m_type = &local_f8->m_type;
              vtx2.m_value = pSStack_100;
              vtx2.m_type = &local_108->m_type;
              vtx3.m_value = pSStack_110;
              vtx3.m_type = &pVVar3->m_type;
              dst_00.super_ConstStridedValueAccess<64>.m_value = local_180;
              dst_00.super_ConstStridedValueAccess<64>.m_type = local_178;
              vtx0.m_value = pSVar4 + (iVar24 + iVar10) * iVar11;
              vtx0.m_type = &pVVar3->m_type;
              local_118 = pVVar3;
              interpolateFragmentInput<64>
                        (dst_00,iVar15,vtx0,vtx1,vtx2,vtx3,fVar25 - fVar31,__x - fVar28);
              iVar15 = iVar15 + 1;
            } while ((int)local_168 + iVar15 != 0);
          }
          ppSVar21 = local_120 + 1;
          this_02 = local_150;
        } while (ppSVar21 !=
                 (local_188->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      rsg::Shader::execute(local_188,&local_c0);
      EVar32 = ExecutionContext::getValue(&local_c0,local_138);
      this_01 = EVar32.super_ConstStridedValueAccess<64>.m_type;
      if (local_148 < local_170) {
        pSVar16 = EVar32.super_ConstStridedValueAccess<64>.m_value + 0xc0;
        uVar23 = local_1d8;
        do {
          uVar5 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
          VariableType::getElementType(this_01);
          iVar15 = pSVar16[-0xc0].intVal;
          VariableType::getElementType(this_01);
          iVar11 = pSVar16[-0x80].intVal;
          VariableType::getElementType(this_01);
          iVar19 = pSVar16[-0x40].intVal;
          VariableType::getElementType(this_01);
          local_198.m_type._4_4_ = iVar11;
          local_198.m_type._0_4_ = iVar15;
          local_198.m_value._0_4_ = iVar19;
          local_198.m_value._4_4_ = pSVar16->intVal;
          tcu::PixelBufferAccess::setPixel
                    (&this_02->m_dst,(Vec4 *)&local_198,(int)((long)uVar5 % (long)iVar1),
                     ~(uint)((long)uVar5 / (long)iVar1) +
                     (this_02->m_dst).super_ConstPixelBufferAccess.m_size.m_data[1],0);
          uVar23 = uVar23 + 1;
          pSVar16 = pSVar16 + 1;
        } while ((long)uVar23 < local_170);
      }
      iVar15 = local_154 + 0x40;
      local_1d8 = local_1d8 + 0x40;
    } while (local_128 != local_140);
  }
  if ((Scalar *)
      local_1b8.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (Scalar *)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ExecutionContext::~ExecutionContext(&local_c0);
  VaryingStore::~VaryingStore(&local_68);
  return;
}

Assistant:

void ProgramExecutor::execute (const Shader& vertexShader, const Shader& fragmentShader, const vector<VariableValue>& uniformValues)
{
	int	gridVtxWidth	= m_gridWidth+1;
	int gridVtxHeight	= m_gridHeight+1;
	int numVertices		= gridVtxWidth*gridVtxHeight;

	VaryingStore varyingStore(numVertices);

	// Execute vertex shader
	{
		ExecutionContext	execCtx(m_samplers2D, m_samplersCube);
		int					numPackets	= numVertices + ((numVertices%EXEC_VEC_WIDTH) ? 1 : 0);

		const vector<ShaderInput*>& inputs	= vertexShader.getInputs();
		vector<const Variable*>		outputs;
		vertexShader.getOutputs(outputs);

		// Set uniform values
		for (vector<VariableValue>::const_iterator uniformIter = uniformValues.begin(); uniformIter != uniformValues.end(); uniformIter++)
			execCtx.getValue(uniformIter->getVariable()) = uniformIter->getValue().value();

		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			int packetStart	= packetNdx*EXEC_VEC_WIDTH;
			int packetEnd	= deMin32((packetNdx+1)*EXEC_VEC_WIDTH, numVertices);

			// Compute values for vertex shader inputs
			for (vector<ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
			{
				const ShaderInput*	input	= *i;
				ExecValueAccess		access	= execCtx.getValue(input->getVariable());

				for (int vtxNdx = packetStart; vtxNdx < packetEnd; vtxNdx++)
				{
					int		y	= (vtxNdx/gridVtxWidth);
					int		x	= vtxNdx - y*gridVtxWidth;
					float	xf	= (float)x / (float)(gridVtxWidth-1);
					float	yf	= (float)y / (float)(gridVtxHeight-1);

					interpolateVertexInput(access, vtxNdx-packetStart, input->getValueRange(), xf, yf);
				}
			}

			// Execute vertex shader for packet
			vertexShader.execute(execCtx);

			// Store output values
			for (vector<const Variable*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
			{
				const Variable*			output	= *i;

				if (deStringEqual(output->getName(), "gl_Position"))
					continue; // Do not store position

				ExecConstValueAccess	access	= execCtx.getValue(output);
				VaryingStorage*			dst		= varyingStore.getStorage(output->getType(), output->getName());

				for (int vtxNdx = packetStart; vtxNdx < packetEnd; vtxNdx++)
				{
					ValueAccess varyingAccess = dst->getValue(output->getType(), vtxNdx);
					copyVarying(varyingAccess, access, vtxNdx-packetStart);
				}
			}
		}
	}

	// Execute fragment shader
	{
		ExecutionContext execCtx(m_samplers2D, m_samplersCube);

		// Assign uniform values
		for (vector<VariableValue>::const_iterator i = uniformValues.begin(); i != uniformValues.end(); i++)
			execCtx.getValue(i->getVariable()) = i->getValue().value();

		const vector<ShaderInput*>& inputs			= fragmentShader.getInputs();
		const Variable*				fragColorVar	= DE_NULL;
		vector<const Variable*>		outputs;

		// Find fragment shader output assigned to location 0. This is fragment color.
		fragmentShader.getOutputs(outputs);
		for (vector<const Variable*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
		{
			if ((*i)->getLayoutLocation() == 0)
			{
				fragColorVar = *i;
				break;
			}
		}
		TCU_CHECK(fragColorVar);

		int	width		= m_dst.getWidth();
		int height		= m_dst.getHeight();
		int numPackets	= (width*height)/EXEC_VEC_WIDTH + (((width*height)%EXEC_VEC_WIDTH) ? 1 : 0);

		float cellWidth		= (float)width	/ (float)m_gridWidth;
		float cellHeight	= (float)height	/ (float)m_gridHeight;

		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			int packetStart	= packetNdx*EXEC_VEC_WIDTH;
			int packetEnd	= deMin32((packetNdx+1)*EXEC_VEC_WIDTH, width*height);

			// Interpolate varyings
			for (vector<ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
			{
				const ShaderInput*		input	= *i;
				ExecValueAccess			access	= execCtx.getValue(input->getVariable());
				const VariableType&		type	= input->getVariable()->getType();
				const VaryingStorage*	src		= varyingStore.getStorage(type, input->getVariable()->getName());

				// \todo [2011-03-08 pyry] Part of this could be pre-computed...
				for (int fragNdx = packetStart; fragNdx < packetEnd; fragNdx++)
				{
					int y = fragNdx/width;
					int x = fragNdx - y*width;
					tcu::IVec4	vtxIndices	= computeVertexIndices(cellWidth, cellHeight, gridVtxWidth, gridVtxHeight, x, y);
					tcu::Vec2	weights		= computeGridCellWeights(cellWidth, cellHeight, x, y);

					interpolateFragmentInput(access, fragNdx-packetStart,
											 src->getValue(type, vtxIndices.x()),
											 src->getValue(type, vtxIndices.y()),
											 src->getValue(type, vtxIndices.z()),
											 src->getValue(type, vtxIndices.w()),
											 weights.x(), weights.y());
				}
			}

			// Execute fragment shader
			fragmentShader.execute(execCtx);

			// Write resulting color
			ExecConstValueAccess colorValue = execCtx.getValue(fragColorVar);
			for (int fragNdx = packetStart; fragNdx < packetEnd; fragNdx++)
			{
				int			y		= fragNdx/width;
				int			x		= fragNdx - y*width;
				int			cNdx	= fragNdx-packetStart;
				tcu::Vec4	c		= tcu::Vec4(colorValue.component(0).asFloat(cNdx),
												colorValue.component(1).asFloat(cNdx),
												colorValue.component(2).asFloat(cNdx),
												colorValue.component(3).asFloat(cNdx));

				// \todo [2012-11-13 pyry] Reverse order.
				m_dst.setPixel(c, x, m_dst.getHeight()-y-1);
			}
		}
	}
}